

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall duckdb::TableAppendState::TableAppendState(TableAppendState *this)

{
  pointer *__ptr;
  LogicalType local_30;
  
  (this->row_group_append_state).parent = this;
  (this->row_group_append_state).states.
  super_unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
  .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>._M_head_impl = (ColumnAppendState *)0x0
  ;
  (this->append_lock)._M_device = (mutex_type *)0x0;
  (this->append_lock)._M_owns = false;
  this->total_append_count = 0;
  this->start_row_group = (RowGroup *)0x0;
  TransactionData::TransactionData(&this->transaction,0,0);
  (this->stats).column_stats.
  super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stats).table_sample.
  super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = (BlockingSample *)0x0;
  (this->stats).column_stats.
  super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stats).column_stats.
  super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stats).stats_lock.internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->stats).stats_lock.internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LogicalType::LogicalType(&local_30,UBIGINT);
  Vector::Vector(&this->hashes,&local_30,0x800);
  LogicalType::~LogicalType(&local_30);
  return;
}

Assistant:

TableAppendState::TableAppendState()
    : row_group_append_state(*this), total_append_count(0), start_row_group(nullptr), transaction(0, 0),
      hashes(LogicalType::HASH) {
}